

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonIO.cc
# Opt level: O3

void __thiscall avro::json::JsonGenerator::encodeNumber(JsonGenerator *this,double t)

{
  char *pcVar1;
  long lVar2;
  char *pcVar3;
  ostringstream oss;
  long *local_1a8;
  size_t local_1a0;
  long local_198 [2];
  undefined1 local_188 [376];
  
  sep(this);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_188);
  if ((ulong)ABS(t) < 0x7ff0000000000000) {
    std::ostream::_M_insert<double>(t);
  }
  else {
    pcVar1 = "-Infinity";
    if (t >= INFINITY) {
      pcVar1 = "Infinity";
    }
    pcVar3 = "NaN";
    if (!NAN(t)) {
      pcVar3 = pcVar1;
    }
    lVar2 = 3;
    if (!NAN(t)) {
      lVar2 = (ulong)(t < INFINITY) + 8;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_188,pcVar3,lVar2);
  }
  std::__cxx11::stringbuf::str();
  StreamWriter::writeBytes(&this->out_,(uint8_t *)local_1a8,local_1a0);
  if (this->top == stKey) {
    this->top = stMapN;
  }
  if (local_1a8 != local_198) {
    operator_delete(local_1a8,local_198[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_188);
  std::ios_base::~ios_base((ios_base *)(local_188 + 0x70));
  return;
}

Assistant:

void JsonGenerator::encodeNumber(double t) {
    sep();
    std::ostringstream oss;
    if (boost::math::isfinite(t)) {
        oss << t;
    } else if (boost::math::isnan(t)) {
        oss << "NaN";
    } else if (t == std::numeric_limits<double>::infinity()) {
        oss << "Infinity";
    } else {
        oss << "-Infinity";
    }
    const std::string& s = oss.str();
    out_.writeBytes(reinterpret_cast<const uint8_t*>(&s[0]), s.size());
    sep2();
}